

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall wasm::TranslateToFuzzReader::makeStringConst(TranslateToFuzzReader *this)

{
  Random *this_00;
  uint32_t uVar1;
  StringConst *pSVar2;
  ulong uVar3;
  char *pcVar4;
  bool bVar5;
  bool bVar6;
  stringstream local_378 [8];
  stringstream wtf8;
  ostream local_368 [376];
  undefined1 local_1f0 [8];
  stringstream wtf16;
  undefined1 local_1e0 [376];
  string_view local_68;
  TranslateToFuzzReader *local_58;
  string local_50;
  
  std::__cxx11::stringstream::stringstream(local_378);
  this_00 = &this->random;
  local_58 = this;
  uVar1 = Random::upTo(this_00,4);
  uVar3 = (ulong)uVar1;
  bVar6 = false;
LAB_00158bc6:
  bVar5 = bVar6;
  bVar6 = uVar3 == 0;
  uVar3 = uVar3 - 1;
  if (bVar6) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1f0);
    std::__cxx11::stringbuf::str();
    wasm::String::convertWTF8ToWTF16(local_1e0,local_50._M_string_length,local_50._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::stringbuf::str();
    IString::IString((IString *)&local_68,&local_50);
    pSVar2 = Builder::makeStringConst(&local_58->builder,(Name)local_68);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1f0);
    std::__cxx11::stringstream::~stringstream(local_378);
    return (Expression *)pSVar2;
  }
  uVar1 = Random::upTo(this_00,6);
  pcVar4 = anon_var_dwarf_b6e16;
  switch(uVar1) {
  case 0:
    uVar1 = Random::upTo(this_00,0x400);
    std::__cxx11::to_string((string *)local_1f0,uVar1);
    std::operator<<(local_368,(string *)local_1f0);
    std::__cxx11::string::~string((string *)local_1f0);
    goto switchD_00158bf4_default;
  case 1:
    break;
  case 2:
    pcVar4 = anon_var_dwarf_b6e31;
    break;
  case 3:
    pcVar4 = anon_var_dwarf_b6e3e;
    break;
  case 4:
    std::operator<<(local_368,anon_var_dwarf_b6e4b);
    bVar6 = true;
    goto LAB_00158bc6;
  case 5:
    goto switchD_00158bf4_caseD_5;
  default:
    goto switchD_00158bf4_default;
  }
switchD_00158bf4_caseD_1:
  std::operator<<(local_368,pcVar4);
switchD_00158bf4_default:
  bVar6 = false;
  goto LAB_00158bc6;
switchD_00158bf4_caseD_5:
  pcVar4 = anon_var_dwarf_b6e58;
  bVar6 = true;
  if (bVar5) goto LAB_00158bc6;
  goto switchD_00158bf4_caseD_1;
}

Assistant:

Expression* TranslateToFuzzReader::makeStringConst() {
  // Construct an interesting WTF-8 string from parts and use string.const.
  std::stringstream wtf8;
  bool lastWasLeadingSurrogate = false;
  for (size_t i = 0, end = upTo(4); i < end; ++i) {
    switch (upTo(6)) {
      case 0:
        // A simple ascii string.
        wtf8 << std::to_string(upTo(1024));
        break;
      case 1:
        // '£'
        wtf8 << "\xC2\xA3";
        break;
      case 2:
        // '€'
        wtf8 << "\xE2\x82\xAC";
        break;
      case 3:
        // '𐍈'
        wtf8 << "\xF0\x90\x8D\x88";
        break;
      case 4:
        // The leading surrogate in '𐍈'
        wtf8 << "\xED\xA0\x80";
        lastWasLeadingSurrogate = true;
        continue;
      case 5:
        if (lastWasLeadingSurrogate) {
          // Avoid invalid WTF-8.
          continue;
        }
        // The trailing surrogate in '𐍈'
        wtf8 << "\xED\xBD\x88";
        break;
    }
    lastWasLeadingSurrogate = false;
  }
  std::stringstream wtf16;
  // TODO: Use wtf16.view() once we have C++20.
  String::convertWTF8ToWTF16(wtf16, wtf8.str());
  return builder.makeStringConst(wtf16.str());
}